

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cc
# Opt level: O2

void __thiscall
tchecker::algorithms::reach::stats_t::attributes
          (stats_t *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *m)

{
  uint *puVar1;
  mapped_type *pmVar2;
  stringstream sstream;
  allocator<char> local_1f1;
  string local_1f0 [32];
  key_type local_1d0;
  stringstream local_1b0 [16];
  long local_1a0;
  string local_198 [16];
  uint auStack_188 [88];
  
  algorithms::stats_t::attributes(&this->super_stats_t,m);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"VISITED_STATES",&local_1f1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar2,local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"",(allocator<char> *)&local_1d0);
  std::__cxx11::stringbuf::str(local_198);
  std::__cxx11::string::~string(local_1f0);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"VISITED_TRANSITIONS",&local_1f1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar2,local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"",(allocator<char> *)&local_1d0);
  std::__cxx11::stringbuf::str(local_198);
  std::__cxx11::string::~string(local_1f0);
  puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::_M_insert<bool>(SUB81(&local_1a0,0));
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"REACHABLE",&local_1f1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar2,local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void stats_t::attributes(std::map<std::string, std::string> & m) const
{
  tchecker::algorithms::stats_t::attributes(m);

  std::stringstream sstream;

  sstream << _visited_states;
  m["VISITED_STATES"] = sstream.str();

  sstream.str("");
  sstream << _visited_transitions;
  m["VISITED_TRANSITIONS"] = sstream.str();

  sstream.str("");
  sstream << std::boolalpha << _reachable;
  m["REACHABLE"] = sstream.str();
}